

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::RefreshBackground(DBaseStatusBar *this)

{
  DFrameBuffer *pDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *texname;
  FTexture *this_00;
  float aspect;
  float local_60;
  uint local_44;
  int local_3c;
  FTexture *p;
  float ratio;
  int y;
  int x2;
  int x;
  DBaseStatusBar *this_local;
  
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  iVar3 = DCanvas::GetHeight((DCanvas *)screen);
  aspect = ActiveRatio(iVar2,iVar3,(float *)0x0);
  if ((aspect < 1.5) || ((this->Scaled & 1U) == 0)) {
    local_3c = *(int *)&(this->super_DObject).field_0x24;
  }
  else {
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    iVar3 = AspectMultiplier(aspect);
    local_3c = (iVar2 * (0x30 - iVar3)) / 0x60;
  }
  y = local_3c;
  if ((local_3c == *(int *)&(this->super_DObject).field_0x24) && (0 < local_3c)) {
    local_44 = this->ST_Y;
  }
  else {
    local_44 = ST_Y;
  }
  if ((this->CompleteBorder & 1U) == 0) {
    iVar2 = DCanvas::GetHeight((DCanvas *)screen);
    if ((int)local_44 < iVar2) {
      iVar2 = DCanvas::GetWidth((DCanvas *)screen);
      V_DrawBorder(local_3c + 1,local_44,iVar2,local_44 + 1);
      iVar2 = DCanvas::GetHeight((DCanvas *)screen);
      iVar3 = DCanvas::GetWidth((DCanvas *)screen);
      iVar4 = DCanvas::GetHeight((DCanvas *)screen);
      V_DrawBorder(local_3c + 1,iVar2 + -1,iVar3,iVar4);
    }
  }
  else {
    y = DCanvas::GetWidth((DCanvas *)screen);
  }
  if (0 < y) {
    if ((this->CompleteBorder & 1U) == 0) {
      if ((aspect < 1.5) || ((this->Scaled & 1U) == 0)) {
        local_60 = (float)(*(int *)&(this->super_DObject).field_0x24 + this->HorizontalResolution);
      }
      else {
        iVar2 = DCanvas::GetWidth((DCanvas *)screen);
        iVar3 = DCanvas::GetWidth((DCanvas *)screen);
        iVar4 = AspectMultiplier(aspect);
        local_60 = (float)(iVar2 - (iVar3 * (0x30 - iVar4) + 0x5f) / 0x60);
      }
      ratio = local_60;
    }
    else {
      ratio = (float)DCanvas::GetWidth((DCanvas *)screen);
    }
    iVar2 = DCanvas::GetHeight((DCanvas *)screen);
    V_DrawBorder(0,local_44,y + 1,iVar2);
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    iVar3 = DCanvas::GetHeight((DCanvas *)screen);
    V_DrawBorder((int)ratio + -1,local_44,iVar2,iVar3);
    if (9 < setblocks) {
      texname = FString::operator_cast_to_char_(&gameinfo.Border.b);
      this_00 = FTextureManager::operator[](&TexMan,texname);
      pDVar1 = screen;
      if (this_00 != (FTexture *)0x0) {
        iVar2 = FTexture::GetHeight(this_00);
        (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (pDVar1,0,(ulong)local_44,(ulong)(uint)y,(ulong)(local_44 + iVar2),this_00,1);
        pDVar1 = screen;
        uVar5 = DCanvas::GetWidth((DCanvas *)screen);
        iVar2 = FTexture::GetHeight(this_00);
        (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (pDVar1,(ulong)(uint)ratio,(ulong)local_44,(ulong)uVar5,(ulong)(local_44 + iVar2),
                   this_00,1);
      }
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::RefreshBackground () const
{
	int x, x2, y;

	float ratio = ActiveRatio (SCREENWIDTH, SCREENHEIGHT);
	x = (ratio < 1.5f || !Scaled) ? ST_X : SCREENWIDTH*(48-AspectMultiplier(ratio))/(48*2);
	y = x == ST_X && x > 0 ? ST_Y : ::ST_Y;

	if(!CompleteBorder)
	{
		if(y < SCREENHEIGHT)
		{
			V_DrawBorder (x+1, y, SCREENWIDTH, y+1);
			V_DrawBorder (x+1, SCREENHEIGHT-1, SCREENWIDTH, SCREENHEIGHT);
		}
	}
	else
	{
		x = SCREENWIDTH;
	}

	if (x > 0)
	{
		if(!CompleteBorder)
		{
			x2 = ratio < 1.5f || !Scaled ? ST_X+HorizontalResolution :
				SCREENWIDTH - (SCREENWIDTH*(48-AspectMultiplier(ratio))+48*2-1)/(48*2);
		}
		else
		{
			x2 = SCREENWIDTH;
		}

		V_DrawBorder (0, y, x+1, SCREENHEIGHT);
		V_DrawBorder (x2-1, y, SCREENWIDTH, SCREENHEIGHT);

		if (setblocks >= 10)
		{
			FTexture *p = TexMan[gameinfo.Border.b];
			if (p != NULL)
			{
				screen->FlatFill(0, y, x, y + p->GetHeight(), p, true);
				screen->FlatFill(x2, y, SCREENWIDTH, y + p->GetHeight(), p, true);
			}
		}
	}
}